

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

void R_Subsector(subsector_t *sub)

{
  undefined8 *puVar1;
  FTextureID FVar2;
  secplane_t *psVar3;
  sector_t *psVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int lightlevel;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar12;
  int iVar13;
  unsigned_short uVar14;
  uint uVar15;
  FMiniBSP *pFVar16;
  FSectorPortal *pFVar17;
  lightlist_t *plVar18;
  sector_t *psVar19;
  extsector_t *peVar20;
  int iVar21;
  seg_t *line;
  DWORD DVar22;
  subsector_t *psVar23;
  long lVar24;
  ulong uVar25;
  uint i;
  long lVar26;
  F3DFloor *pFVar27;
  int ceilinglightlevel;
  int floorlightlevel;
  code *pcStackY_2d0;
  int local_2c0;
  int local_2bc;
  subsector_t *local_2b8;
  visplane_t *local_2b0;
  visplane_t *local_2a8 [2];
  sector_t local_298;
  
  psVar23 = InSubsector;
  if ((InSubsector == (subsector_t *)0x0) &&
     (InSubsector = sub,
     (long)numsubsectors <= ((long)sub - (long)subsectors >> 5) * -0x5555555555555555)) {
    pcStackY_2d0 = (code *)0x2fefae;
    I_Error("R_Subsector: ss %ti with numss = %i");
  }
  psVar19 = sub->sector;
  if (psVar19 == (sector_t *)0x0) {
    pcStackY_2d0 = R_RenderBSPNode;
    __assert_fail("sub->sector != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_bsp.cpp"
                  ,0x42d,"void R_Subsector(subsector_t *)");
  }
  if (sub->polys != (FPolyNode *)0x0) {
    pFVar16 = sub->BSP;
    if ((pFVar16 == (FMiniBSP *)0x0) || (pFVar16->bDirty == true)) {
      pcStackY_2d0 = (code *)0x2fefd7;
      subsector_t::BuildPolyBSP(sub);
      pFVar16 = sub->BSP;
    }
    uVar15 = (pFVar16->Nodes).Count;
    if (uVar15 == 0) {
      pcStackY_2d0 = (code *)0x2ff160;
      R_Subsector((pFVar16->Subsectors).Array);
    }
    else {
      pcStackY_2d0 = (code *)0x2feff9;
      R_RenderBSPNode((pFVar16->Nodes).Array + (uVar15 - 1));
    }
    goto LAB_002fff59;
  }
  frontsector = psVar19;
  *(byte *)&psVar19->MoreFlags = (byte)psVar19->MoreFlags | 0x80;
  pcStackY_2d0 = (code *)0x2ff023;
  frontsector = R_FakeFlat(psVar19,&local_298,&local_2bc,&local_2c0,false);
  iVar13 = local_2bc;
  iVar21 = local_2c0;
  if ((level.fadeto == 0) && ((frontsector->ColorMap->Fade).field_0.d == 0)) {
    foggy = SUB41((level.flags & 8) >> 3,0);
    if ((level.flags & 8) != 0) goto LAB_002ff055;
    r_actualextralight = extralight << 4;
  }
  else {
    foggy = true;
LAB_002ff055:
    r_actualextralight = 0;
  }
  if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
     ((frontsector->e->XFloor).lightlist.Count != 0)) {
    pcStackY_2d0 = (code *)0x2ff193;
    plVar18 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
    basecolormap = plVar18->extra_colormap;
    if (plVar18->p_lightlevel != &frontsector->lightlevel) {
      local_2c0 = (int)*plVar18->p_lightlevel;
    }
  }
  else {
    basecolormap = frontsector->ColorMap;
  }
  pcStackY_2d0 = (code *)0x2ff097;
  pFVar17 = sector_t::ValidatePortal(frontsector,1);
  dVar5 = ViewPos.Z * (frontsector->ceilingplane).normal.Z +
          ViewPos.X * (frontsector->ceilingplane).normal.X +
          ViewPos.Y * (frontsector->ceilingplane).normal.Y + (frontsector->ceilingplane).D;
  FVar2.texnum = frontsector->planes[1].Texture.texnum;
  if ((((-1.52587890625e-05 <= dVar5) && (1.52587890625e-05 < dVar5)) ||
      (pFVar17 != (FSectorPortal *)0x0 || FVar2.texnum == skyflatnum.texnum)) ||
     (((psVar19 = frontsector->heightsec, psVar19 != (sector_t *)0x0 &&
       ((psVar19->MoreFlags & 0x10) == 0)) &&
      (psVar19->planes[0].Texture.texnum == skyflatnum.texnum)))) {
    pcStackY_2d0 = (code *)0x2ff14b;
    ceilingplane = R_FindPlane(&frontsector->ceilingplane,FVar2,r_actualextralight + local_2c0,
                               frontsector->planes[1].alpha,
                               SUB41((frontsector->planes[1].Flags & 4U) >> 2,0),
                               &frontsector->planes[1].xform,frontsector->sky,pFVar17);
  }
  else {
    ceilingplane = (visplane_t *)0x0;
  }
  if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
     ((frontsector->e->XFloor).lightlist.Count != 0)) {
    pcStackY_2d0 = (code *)0x2ff2f8;
    plVar18 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
    basecolormap = plVar18->extra_colormap;
    if (plVar18->p_lightlevel != &frontsector->lightlevel) {
      local_2bc = (int)*plVar18->p_lightlevel;
    }
  }
  else {
    basecolormap = frontsector->ColorMap;
  }
  pcStackY_2d0 = (code *)0x2ff217;
  pFVar17 = sector_t::ValidatePortal(frontsector,0);
  dVar5 = ViewPos.Z * (frontsector->floorplane).normal.Z +
          ViewPos.X * (frontsector->floorplane).normal.X +
          ViewPos.Y * (frontsector->floorplane).normal.Y + (frontsector->floorplane).D;
  FVar2.texnum = frontsector->planes[0].Texture.texnum;
  if (((-1.52587890625e-05 <= dVar5) && (1.52587890625e-05 < dVar5)) ||
     ((pFVar17 != (FSectorPortal *)0x0 || FVar2.texnum == skyflatnum.texnum ||
      (((psVar19 = frontsector->heightsec, psVar19 != (sector_t *)0x0 &&
        ((psVar19->MoreFlags & 0x10) == 0)) &&
       (psVar19->planes[1].Texture.texnum == skyflatnum.texnum)))))) {
    pcStackY_2d0 = (code *)0x2ff2be;
    floorplane = R_FindPlane(&frontsector->floorplane,FVar2,r_actualextralight + local_2bc,
                             frontsector->planes[0].alpha,
                             SUB41((frontsector->planes[0].Flags & 4U) >> 2,0),
                             (FTransform *)frontsector,frontsector->sky,pFVar17);
  }
  else {
    floorplane = (visplane_t *)0x0;
  }
  if (((r_3dfloors.Value != 0) && (peVar20 = frontsector->e, peVar20 != (extsector_t *)0x0)) &&
     (uVar15 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count, uVar15 != 0)) {
    local_2b8 = psVar23;
    local_2a8[1] = ceilingplane;
    local_2a8[0] = (visplane_t *)CONCAT44(local_2a8[0]._4_4_,iVar21);
    local_2b0 = floorplane;
    if ((int)uVar15 < 1) {
LAB_002ff6ba:
      uVar25 = 0;
      do {
        fakeFloor = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar25];
        uVar15 = fakeFloor->flags;
        if ((((uVar15 & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
           (psVar3 = (fakeFloor->top).plane, (psVar3->normal).Y == 0.0 && (psVar3->normal).X == 0.0)
           ) {
          if ((uVar15 & 0x2c) != 0x20) {
            pcStackY_2d0 = (code *)0x2ff71e;
            R_3D_AddHeight((fakeFloor->bottom).plane,frontsector);
            uVar15 = fakeFloor->flags;
          }
          if (((uVar15 & 8) != 0) &&
             ((uVar15 & 0x40400010) != 0x400010 && (long)fakeFloor->alpha != 0)) {
            auVar6 = SEXT816((long)fakeFloor->alpha << 0x10) * ZEXT816(0x8080808080808081);
            fakeAlpha = (int)(auVar6._8_8_ >> 7) - (auVar6._12_4_ >> 0x1f);
            if (0xffff < fakeAlpha) {
              fakeAlpha = 0x10000;
            }
            if (fakeFloor->validcount != validcount) {
              fakeFloor->validcount = validcount;
              pcStackY_2d0 = (code *)0x2ff7a6;
              R_3D_NewClip();
            }
            pFVar27 = fakeFloor;
            psVar3 = (fakeFloor->bottom).plane;
            dVar7 = (frontsector->centerspot).X;
            dVar8 = (frontsector->centerspot).Y;
            dVar5 = ((psVar3->normal).Y * dVar8 + psVar3->D + (psVar3->normal).X * dVar7) *
                    psVar3->negiC;
            if ((ViewPos.Z < dVar5) &&
               (dVar5 < ((frontsector->ceilingplane).normal.Y * dVar8 +
                        (frontsector->ceilingplane).D + (frontsector->ceilingplane).normal.X * dVar7
                        ) * (frontsector->ceilingplane).negiC)) {
              fake3D = 2;
              psVar19 = fakeFloor->model;
              lVar26 = 0x38;
              do {
                *(undefined8 *)((long)&local_2b0 + lVar26) =
                     *(undefined8 *)((long)psVar19->planes + lVar26 + -0x18);
                puVar1 = (undefined8 *)((long)psVar19->planes + lVar26 + -0x38);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                puVar1 = (undefined8 *)((long)psVar19->planes + lVar26 + -0x28);
                uVar11 = puVar1[1];
                *(undefined8 *)((long)&local_2c0 + lVar26) = *puVar1;
                *(undefined8 *)((long)&local_2b8 + lVar26) = uVar11;
                *(undefined8 *)((long)&pcStackY_2d0 + lVar26) = uVar9;
                *(undefined8 *)(&stack0xfffffffffffffd38 + lVar26) = uVar10;
                puVar1 = (undefined8 *)((long)psVar19->planes + lVar26 + -0x10);
                uVar9 = puVar1[1];
                *(undefined8 *)((long)local_2a8 + lVar26) = *puVar1;
                *(undefined8 *)((long)local_298.planes + lVar26 + -8) = uVar9;
                puVar1 = (undefined8 *)((long)&psVar19->planes[0].xform.xOffs + lVar26);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                puVar1 = (undefined8 *)((long)&psVar19->planes[0].xform.baseyOffs + lVar26);
                uVar11 = puVar1[1];
                *(undefined8 *)((long)&local_298.planes[0].xform.baseyOffs + lVar26) = *puVar1;
                *(undefined8 *)((long)&local_298.planes[0].xform.xScale + lVar26) = uVar11;
                *(undefined8 *)((long)&local_298.planes[0].xform.xOffs + lVar26) = uVar9;
                *(undefined8 *)((long)&local_298.planes[0].xform.yOffs + lVar26) = uVar10;
                lVar26 = lVar26 + 0x58;
              } while (lVar26 != 0xe8);
              local_298.floorplane.normal.Z = (psVar19->floorplane).normal.Z;
              local_298.floorplane.normal.X = (psVar19->floorplane).normal.X;
              local_298.floorplane.normal.Y = (psVar19->floorplane).normal.Y;
              local_298.floorplane.D = (psVar19->floorplane).D;
              local_298.floorplane.negiC = (psVar19->floorplane).negiC;
              local_298.ceilingplane.normal.Z = (psVar19->ceilingplane).normal.Z;
              local_298.ceilingplane.normal.X = (psVar19->ceilingplane).normal.X;
              local_298.ceilingplane.normal.Y = (psVar19->ceilingplane).normal.Y;
              local_298.ceilingplane.D = (psVar19->ceilingplane).D;
              local_298.ceilingplane.negiC = (psVar19->ceilingplane).negiC;
              local_298.ColorMap = psVar19->ColorMap;
              aVar12 = (psVar19->SoundTarget).field_0;
              local_298.seqType = psVar19->seqType;
              local_298._278_2_ = *(undefined2 *)&psVar19->field_0x116;
              local_298.sky = psVar19->sky;
              local_298._272_4_ =
                   SUB84((ulong)*(undefined8 *)((long)&(psVar19->SoundTarget).field_0 + 4) >> 0x20,0
                        );
              local_298.SoundTarget.field_0._0_4_ = aVar12._0_4_;
              local_298.SoundTarget.field_0._4_4_ = aVar12._4_4_;
              local_298.SeqName.super_FName.Index = (FName)(psVar19->SeqName).super_FName.Index;
              local_298.centerspot.X = (psVar19->centerspot).X;
              local_298.centerspot.Y = (psVar19->centerspot).Y;
              pcStackY_2d0 = (code *)0x2ff943;
              memcpy(&local_298.validcount,&psVar19->validcount,0xa0);
              local_298.damagetype.super_FName.Index =
                   (FName)(psVar19->damagetype).super_FName.Index;
              pcStackY_2d0 = (code *)0x2ff96d;
              memcpy(&local_298.damageamount,&psVar19->damageamount,0x94);
              psVar3 = (pFVar27->top).plane;
              local_298.floorplane.normal.Z = (psVar3->normal).Z;
              local_298.floorplane.normal.X = (psVar3->normal).X;
              local_298.floorplane.normal.Y = (psVar3->normal).Y;
              local_298.floorplane.D = psVar3->D;
              local_298.floorplane.negiC = psVar3->negiC;
              psVar3 = (pFVar27->bottom).plane;
              local_298.ceilingplane.normal.Z = (psVar3->normal).Z;
              local_298.ceilingplane.normal.X = (psVar3->normal).X;
              local_298.ceilingplane.normal.Y = (psVar3->normal).Y;
              local_298.ceilingplane.negiC = psVar3->negiC;
              uVar15 = pFVar27->flags & 0x40400000;
              if ((uVar15 == 0x40400000) || (lVar26 = 1, uVar15 == 0)) {
                local_298.planes[1].Texture.texnum = local_298.planes[0].Texture.texnum;
                lVar26 = 0;
              }
              frontsector = &local_298;
              dVar5 = local_298.ceilingplane.normal.Z * 1.52587890625e-05;
              local_298.ceilingplane.D = psVar3->D + dVar5;
              if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                pcStackY_2d0 = (code *)0x2ffa44;
                plVar18 = P_GetPlaneLight(sub->sector,&local_298.ceilingplane,false);
                basecolormap = plVar18->extra_colormap;
                local_2c0 = (int)*plVar18->p_lightlevel;
                dVar5 = local_298.ceilingplane.normal.Z * 1.52587890625e-05;
                pFVar27 = fakeFloor;
              }
              local_298.ceilingplane.D = local_298.ceilingplane.D - dVar5;
              floorplane = (visplane_t *)0x0;
              pcStackY_2d0 = (code *)0x2ffae3;
              ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                         (FTextureID)frontsector->planes[1].Texture.texnum,
                                         r_actualextralight + local_2c0,frontsector->planes[1].alpha
                                         ,(bool)((byte)(pFVar27->flags >> 0x1c) & 1),
                                         &frontsector->planes[lVar26].xform,frontsector->sky,
                                         (FSectorPortal *)0x0);
              pcStackY_2d0 = (code *)0x2ffaf5;
              R_FakeDrawLoop(sub);
              fake3D = 0;
              frontsector = sub->sector;
            }
          }
        }
        uVar25 = uVar25 + 1;
        peVar20 = frontsector->e;
      } while (uVar25 < (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
    else {
      lVar26 = 0;
      do {
        fakeFloor = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar26];
        uVar15 = fakeFloor->flags;
        if ((((uVar15 & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
           (psVar3 = (fakeFloor->bottom).plane,
           (psVar3->normal).Y == 0.0 && (psVar3->normal).X == 0.0)) {
          if ((uVar15 & 0x2c) != 0x20) {
            pcStackY_2d0 = (code *)0x2ff412;
            R_3D_AddHeight((fakeFloor->top).plane,frontsector);
            uVar15 = fakeFloor->flags;
          }
          if (((uVar15 & 8) != 0) && ((~uVar15 & 0x40400000) != 0 && (long)fakeFloor->alpha != 0)) {
            auVar6 = SEXT816((long)fakeFloor->alpha << 0x10) * ZEXT816(0x8080808080808081);
            fakeAlpha = (int)(auVar6._8_8_ >> 7) - (auVar6._12_4_ >> 0x1f);
            if (0xffff < fakeAlpha) {
              fakeAlpha = 0x10000;
            }
            if (fakeFloor->validcount != validcount) {
              fakeFloor->validcount = validcount;
              pcStackY_2d0 = (code *)0x2ff491;
              R_3D_NewClip();
            }
            psVar3 = (fakeFloor->top).plane;
            dVar7 = (frontsector->centerspot).X;
            dVar8 = (frontsector->centerspot).Y;
            dVar5 = ((psVar3->normal).Y * dVar8 + psVar3->D + (psVar3->normal).X * dVar7) *
                    psVar3->negiC;
            if ((dVar5 < ViewPos.Z) &&
               (((frontsector->floorplane).normal.Y * dVar8 +
                (frontsector->floorplane).D + (frontsector->floorplane).normal.X * dVar7) *
                (frontsector->floorplane).negiC < dVar5)) {
              fake3D = 1;
              pcStackY_2d0 = (code *)0x2ff52c;
              sector_t::operator=(&local_298,fakeFloor->model);
              FVar2.texnum = local_298.planes[0].Texture.texnum;
              psVar3 = (fakeFloor->top).plane;
              local_298.floorplane.normal.Z = (psVar3->normal).Z;
              local_298.floorplane.normal.X = (psVar3->normal).X;
              local_298.floorplane.normal.Y = (psVar3->normal).Y;
              local_298.floorplane.D = psVar3->D;
              local_298.floorplane.negiC = psVar3->negiC;
              psVar3 = (fakeFloor->bottom).plane;
              local_298.ceilingplane.normal.Z = (psVar3->normal).Z;
              local_298.ceilingplane.normal.X = (psVar3->normal).X;
              local_298.ceilingplane.normal.Y = (psVar3->normal).Y;
              local_298.ceilingplane.D = psVar3->D;
              local_298.ceilingplane.negiC = psVar3->negiC;
              if ((fakeFloor->flags & 0x40400000) == 0) {
                local_298.planes[0].Texture.texnum = local_298.planes[1].Texture.texnum;
                lVar24 = 1;
                if (FVar2.texnum != local_298.planes[1].Texture.texnum) {
                  pcStackY_2d0 = (code *)0x2ff5b3;
                  sector_t::AdjustFloorClip(&local_298);
                }
              }
              else {
                lVar24 = 0;
              }
              frontsector = &local_298;
              if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                pcStackY_2d0 = (code *)0x2ff5f5;
                plVar18 = P_GetPlaneLight(sub->sector,&local_298.floorplane,false);
                basecolormap = plVar18->extra_colormap;
                local_2bc = (int)*plVar18->p_lightlevel;
              }
              ceilingplane = (visplane_t *)0x0;
              pcStackY_2d0 = (code *)0x2ff661;
              floorplane = R_FindPlane(&frontsector->floorplane,
                                       (FTextureID)frontsector->planes[0].Texture.texnum,
                                       r_actualextralight + local_2bc,frontsector->planes[0].alpha,
                                       (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                       &frontsector->planes[lVar24].xform,frontsector->sky,
                                       (FSectorPortal *)0x0);
              pcStackY_2d0 = (code *)0x2ff673;
              R_FakeDrawLoop(sub);
              fake3D = 0;
              frontsector = sub->sector;
            }
          }
        }
        lVar26 = lVar26 + 1;
        peVar20 = frontsector->e;
        uVar15 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      } while (lVar26 < (int)uVar15);
      if (uVar15 != 0) goto LAB_002ff6ba;
    }
    fakeFloor = (F3DFloor *)0x0;
    floorplane = local_2b0;
    ceilingplane = local_2a8[1];
    psVar23 = local_2b8;
    iVar21 = (int)local_2a8[0];
  }
  basecolormap = frontsector->ColorMap;
  lightlevel = iVar13;
  if (frontsector->planes[1].Texture.texnum == skyflatnum.texnum) {
    lightlevel = iVar21;
  }
  pcStackY_2d0 = (code *)0x2ffba2;
  local_2c0 = iVar21;
  local_2bc = iVar13;
  R_AddSprites(sub->sector,lightlevel,(uint)FakeSide);
  uVar25 = ((long)sub - (long)subsectors >> 5) * -0x5555555555555555;
  if (((uint)uVar25 < (uint)numsubsectors) &&
     (uVar14 = ParticlesInSubsec.Array[uVar25 & 0xffffffff], uVar14 != 0xffff)) {
    iVar21 = ((uint)((local_2c0 + local_2bc) - (local_2c0 + local_2bc >> 0x1f)) >> 1) +
             r_actualextralight;
    do {
      pcStackY_2d0 = (code *)0x2ffc27;
      R_ProjectParticle(Particles + uVar14,sub->sector,iVar21 * -0x4000 + 0x3d0000,(uint)FakeSide);
      uVar14 = Particles[uVar14].snext;
    } while (uVar14 != 0xffff);
  }
  DVar22 = sub->numlines;
  if (DVar22 != 0) {
    line = sub->firstline;
    local_2b8 = psVar23;
    do {
      if (((psVar23 != (subsector_t *)0x0) || (line->sidedef == (side_t *)0x0)) ||
         ((line->sidedef->Flags & 0x40) == 0)) {
        if (((r_3dfloors.Value != 0) && (psVar19 = line->backsector, psVar19 != (sector_t *)0x0)) &&
           ((frontsector->e != (extsector_t *)0x0 &&
            (peVar20 = psVar19->e,
            (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)))) {
          local_2a8[0] = floorplane;
          local_2b0 = ceilingplane;
          floorplane = (visplane_t *)0x0;
          ceilingplane = (visplane_t *)0x0;
          uVar25 = 0;
          do {
            pFVar27 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar25];
            if (((~pFVar27->flags & 9) == 0) && (psVar4 = pFVar27->model, psVar4 != (sector_t *)0x0)
               ) {
              fake3D = 4;
              lVar26 = 0x38;
              do {
                *(undefined8 *)((long)&local_2b0 + lVar26) =
                     *(undefined8 *)((long)psVar4->planes + lVar26 + -0x18);
                puVar1 = (undefined8 *)((long)psVar4->planes + lVar26 + -0x38);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                puVar1 = (undefined8 *)((long)psVar4->planes + lVar26 + -0x28);
                uVar11 = puVar1[1];
                *(undefined8 *)((long)&local_2c0 + lVar26) = *puVar1;
                *(undefined8 *)((long)&local_2b8 + lVar26) = uVar11;
                *(undefined8 *)((long)&pcStackY_2d0 + lVar26) = uVar9;
                *(undefined8 *)(&stack0xfffffffffffffd38 + lVar26) = uVar10;
                puVar1 = (undefined8 *)((long)psVar4->planes + lVar26 + -0x10);
                uVar9 = puVar1[1];
                *(undefined8 *)((long)local_2a8 + lVar26) = *puVar1;
                *(undefined8 *)((long)local_298.planes + lVar26 + -8) = uVar9;
                puVar1 = (undefined8 *)((long)&psVar4->planes[0].xform.xOffs + lVar26);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                puVar1 = (undefined8 *)((long)&psVar4->planes[0].xform.baseyOffs + lVar26);
                uVar11 = puVar1[1];
                *(undefined8 *)((long)&local_298.planes[0].xform.baseyOffs + lVar26) = *puVar1;
                *(undefined8 *)((long)&local_298.planes[0].xform.xScale + lVar26) = uVar11;
                *(undefined8 *)((long)&local_298.planes[0].xform.xOffs + lVar26) = uVar9;
                *(undefined8 *)((long)&local_298.planes[0].xform.yOffs + lVar26) = uVar10;
                lVar26 = lVar26 + 0x58;
              } while (lVar26 != 0xe8);
              local_298.floorplane.normal.Z = (psVar4->floorplane).normal.Z;
              local_298.floorplane.normal.X = (psVar4->floorplane).normal.X;
              local_298.floorplane.normal.Y = (psVar4->floorplane).normal.Y;
              local_298.floorplane.D = (psVar4->floorplane).D;
              local_298.floorplane.negiC = (psVar4->floorplane).negiC;
              local_298.ceilingplane.normal.Z = (psVar4->ceilingplane).normal.Z;
              local_298.ceilingplane.normal.X = (psVar4->ceilingplane).normal.X;
              local_298.ceilingplane.normal.Y = (psVar4->ceilingplane).normal.Y;
              local_298.ceilingplane.D = (psVar4->ceilingplane).D;
              local_298.ceilingplane.negiC = (psVar4->ceilingplane).negiC;
              local_298.ColorMap = psVar4->ColorMap;
              aVar12 = (psVar4->SoundTarget).field_0;
              local_298.seqType = psVar4->seqType;
              local_298._278_2_ = *(undefined2 *)&psVar4->field_0x116;
              local_298.sky = psVar4->sky;
              local_298._272_4_ =
                   SUB84((ulong)*(undefined8 *)((long)&(psVar4->SoundTarget).field_0 + 4) >> 0x20,0)
              ;
              local_298.SoundTarget.field_0._0_4_ = aVar12._0_4_;
              local_298.SoundTarget.field_0._4_4_ = aVar12._4_4_;
              local_298.SeqName.super_FName.Index = (FName)(psVar4->SeqName).super_FName.Index;
              local_298.centerspot.X = (psVar4->centerspot).X;
              local_298.centerspot.Y = (psVar4->centerspot).Y;
              pcStackY_2d0 = (code *)0x2ffe15;
              fakeFloor = pFVar27;
              memcpy(&local_298.validcount,&psVar4->validcount,0xa0);
              local_298.damagetype.super_FName.Index = (FName)(psVar4->damagetype).super_FName.Index
              ;
              pcStackY_2d0 = (code *)0x2ffe40;
              memcpy(&local_298.damageamount,&psVar4->damageamount,0x94);
              psVar3 = (pFVar27->top).plane;
              local_298.floorplane.normal.Z = (psVar3->normal).Z;
              local_298.floorplane.normal.X = (psVar3->normal).X;
              local_298.floorplane.normal.Y = (psVar3->normal).Y;
              local_298.floorplane.D = psVar3->D;
              local_298.floorplane.negiC = psVar3->negiC;
              psVar3 = (pFVar27->bottom).plane;
              local_298.ceilingplane.normal.Z = (psVar3->normal).Z;
              local_298.ceilingplane.normal.X = (psVar3->normal).X;
              local_298.ceilingplane.normal.Y = (psVar3->normal).Y;
              local_298.ceilingplane.D = psVar3->D;
              local_298.ceilingplane.negiC = psVar3->negiC;
              backsector = &local_298;
              if (pFVar27->validcount != validcount) {
                pFVar27->validcount = validcount;
                pcStackY_2d0 = (code *)0x2ffeb7;
                R_3D_NewClip();
              }
              pcStackY_2d0 = (code *)0x2ffebf;
              R_AddLine(line);
              psVar19 = line->backsector;
            }
            uVar25 = uVar25 + 1;
            peVar20 = psVar19->e;
          } while (uVar25 < (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
          fakeFloor = (F3DFloor *)0x0;
          fake3D = 0;
          floorplane = local_2a8[0];
          ceilingplane = local_2b0;
          psVar23 = local_2b8;
        }
        pcStackY_2d0 = (code *)0x2fff26;
        R_AddLine(line);
      }
      DVar22 = DVar22 - 1;
      line = line + 1;
    } while (DVar22 != 0);
  }
LAB_002fff59:
  if (psVar23 == (subsector_t *)0x0) {
    InSubsector = (subsector_t *)0x0;
  }
  return;
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}